

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddNaryExtendedInstruction
          (InstructionBuilder *this,uint32_t result_type,uint32_t set,uint32_t instruction,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ext_operands)

{
  array<signed_char,_4UL> *paVar1;
  IRContext *pIVar2;
  InstructionBuilder *this_00;
  uint32_t res_id;
  Instruction *pIVar3;
  array<signed_char,_4UL> *paVar4;
  size_type __dnew;
  string message;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  undefined1 local_b8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_98;
  undefined1 local_88 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_60;
  uint32_t local_54;
  InstructionBuilder *local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._24_8_ = local_b8 + 0x10;
  local_b8._0_8_ = &PTR__SmallVector_00930a20;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._16_4_ = set;
  local_b8._8_8_ = 1;
  local_88._0_4_ = SPV_OPERAND_TYPE_ID;
  local_88._8_8_ = &PTR__SmallVector_00930a20;
  local_88._16_8_ = 0;
  local_88._32_8_ = local_88 + 0x18;
  local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_54 = result_type;
  local_50 = this;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_88);
  local_88._8_8_ = &PTR__SmallVector_00930a20;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_60,local_60._M_head_impl);
  }
  local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_00930a20;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  local_b8._0_8_ = &PTR__SmallVector_00930a20;
  local_b8._24_8_ = local_b8 + 0x10;
  local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._16_4_ = instruction;
  local_b8._8_8_ = 1;
  local_88._0_4_ = 7;
  local_88._8_8_ = &PTR__SmallVector_00930a20;
  local_88._16_8_ = (_func_int **)0x0;
  local_88._32_8_ = local_88 + 0x18;
  local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_b8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_88);
  local_88._8_8_ = &PTR__SmallVector_00930a20;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_60,local_60._M_head_impl);
  }
  local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_b8._0_8_ = &PTR__SmallVector_00930a20;
  if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,local_98._M_head_impl);
  }
  paVar4 = (array<signed_char,_4UL> *)
           (ext_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  paVar1 = (array<signed_char,_4UL> *)
           (ext_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar4 != paVar1) {
    do {
      local_b8._0_8_ = &PTR__SmallVector_00930a20;
      local_b8._24_8_ = local_b8 + 0x10;
      local_98._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_b8._16_4_ = *&paVar4->_M_elems;
      local_b8._8_8_ = 1;
      local_88._0_4_ = 1;
      local_88._8_8_ = &PTR__SmallVector_00930a20;
      local_88._16_8_ = (_func_int **)0x0;
      local_88._32_8_ = local_88 + 0x18;
      local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_b8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_88);
      local_88._8_8_ = &PTR__SmallVector_00930a20;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_60,local_60._M_head_impl);
      }
      local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_b8._0_8_ = &PTR__SmallVector_00930a20;
      if (local_98._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_98,local_98._M_head_impl);
      }
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar1);
  }
  this_00 = local_50;
  pIVar2 = local_50->context_;
  res_id = Module::TakeNextIdBound
                     ((pIVar2->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((pIVar2->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_b8._0_8_ = (_func_int **)0x25;
    local_88._0_8_ = (Instruction *)(local_88 + 0x10);
    local_88._0_8_ = std::__cxx11::string::_M_create((ulong *)local_88,(ulong)local_b8);
    local_88._16_8_ = local_b8._0_8_;
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    next_node_ = (Instruction *)0x797254202e776f6c;
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    previous_node_ = (Instruction *)0x676e696e6e757220;
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    is_sentinel_ = true;
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x19 = 'c';
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1a = 'o';
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1b = 'm';
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1c = 'p';
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1d = 'a';
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1e = 'c';
    (((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    field_0x1f = 't';
    *(undefined8 *)
     &(((Instruction *)local_88._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      field_0x1d = 0x2e7364692d746361;
    local_88._8_8_ = local_b8._0_8_;
    *(char *)((long)&(((Instruction *)local_88._0_8_)->
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase +
             local_b8._0_8_) = '\0';
    local_b8._0_8_ = (_func_int **)0x0;
    local_b8._8_8_ = 0;
    local_b8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_b8._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar2->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_b8,(char *)local_88._0_8_
              );
    if ((Instruction *)local_88._0_8_ != (Instruction *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  else if (res_id != 0) {
    pIVar3 = (Instruction *)operator_new(0x70);
    Instruction::Instruction(pIVar3,this_00->context_,OpExtInst,local_54,res_id,&local_48);
    local_88._0_8_ = pIVar3;
    pIVar3 = AddInstruction(this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                     *)local_88);
    if ((Instruction *)local_88._0_8_ != (Instruction *)0x0) {
      (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->_vptr_IntrusiveNodeBase
        [1])();
    }
    goto LAB_00567367;
  }
  pIVar3 = (Instruction *)0x0;
LAB_00567367:
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  return pIVar3;
}

Assistant:

Instruction* AddNaryExtendedInstruction(
      uint32_t result_type, uint32_t set, uint32_t instruction,
      const std::vector<uint32_t>& ext_operands) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {set}});
    operands.push_back(
        {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {instruction}});
    for (uint32_t id : ext_operands) {
      operands.push_back({SPV_OPERAND_TYPE_ID, {id}});
    }

    uint32_t result_id = GetContext()->TakeNextId();
    if (result_id == 0) {
      return nullptr;
    }

    std::unique_ptr<Instruction> new_inst(new Instruction(
        GetContext(), spv::Op::OpExtInst, result_type, result_id, operands));
    return AddInstruction(std::move(new_inst));
  }